

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

void __thiscall
cfd::core::DescriptorScriptReference::DescriptorScriptReference
          (DescriptorScriptReference *this,Script *locking_script,DescriptorScriptType script_type,
          vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
          *key_list,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *address_prefixes,uint32_t req_sig_num)

{
  this->script_type_ = script_type;
  Script::Script(&this->locking_script_,locking_script);
  this->is_script_ = false;
  Script::Script(&this->redeem_script_);
  core::Address::Address(&this->address_script_);
  this->req_num_ = req_sig_num;
  TapBranch::TapBranch(&this->tapbranch_);
  this->is_tapbranch_ = false;
  TaprootScriptTree::TaprootScriptTree(&this->script_tree_);
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->child_script_).
  super___shared_ptr<cfd::core::DescriptorScriptReference,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>::
  vector(&this->keys_,key_list);
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_,address_prefixes);
  return;
}

Assistant:

DescriptorScriptReference::DescriptorScriptReference(
    const Script& locking_script, DescriptorScriptType script_type,
    const std::vector<DescriptorKeyReference>& key_list,
    const std::vector<AddressFormatData>& address_prefixes,
    const uint32_t req_sig_num)
    : script_type_(script_type),
      locking_script_(locking_script),
      is_script_(false),
      req_num_(req_sig_num),
      is_tapbranch_(false),
      keys_(key_list),
      addr_prefixes_(address_prefixes) {
  // do nothing
}